

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matsolve.c
# Opt level: O0

MATRIX mat_lsolve(MATRIX a,MATRIX b)

{
  MATRIX A_00;
  MATRIX B_00;
  MATRIX X_00;
  MATRIX P_00;
  long in_RDI;
  int n;
  MATRIX P;
  MATRIX X;
  MATRIX B;
  MATRIX A;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar1;
  undefined8 in_stack_ffffffffffffffd0;
  int type;
  MATRIX in_stack_ffffffffffffffd8;
  
  type = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  uVar1 = *(undefined4 *)(in_RDI + -4);
  A_00 = mat_copy(in_stack_ffffffffffffffd8);
  B_00 = mat_copy(in_stack_ffffffffffffffd8);
  X_00 = mat_creat((int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),(int)in_stack_ffffffffffffffd8,
                   type);
  P_00 = mat_creat((int)((ulong)X_00 >> 0x20),(int)X_00,type);
  mat_lu(A_00,P_00);
  mat_backsubs1(A_00,B_00,X_00,P_00,0);
  mat_free((MATRIX)CONCAT44(uVar1,in_stack_ffffffffffffffc8));
  mat_free((MATRIX)CONCAT44(uVar1,in_stack_ffffffffffffffc8));
  mat_free((MATRIX)CONCAT44(uVar1,in_stack_ffffffffffffffc8));
  return X_00;
}

Assistant:

MATRIX mat_lsolve( MATRIX a, MATRIX b )
{
	MATRIX	A, B, X, P;
	int	n;

	n = MatCol(a);
	A = mat_copy(a);
	B = mat_copy(b);
	X = mat_creat(n, 1, ZERO_MATRIX);
	P = mat_creat(n, 1, UNDEFINED);

	mat_lu( A, P );
	mat_backsubs1( A, B, X, P, 0 );

	mat_free(A);
	mat_free(B);
	mat_free(P);
	return (X);
}